

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitTOIDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitTOIDecPOMDPDiscrete::SetProblem
          (PlanningUnitTOIDecPOMDPDiscrete *this,TOIDecPOMDPDiscrete *p)

{
  DecPOMDPDiscreteInterface *p_00;
  
  if (this->_m_TOIDecPOMDPDiscrete != p) {
    this->_m_TOIDecPOMDPDiscrete = p;
    if (p == (TOIDecPOMDPDiscrete *)0x0) {
      p_00 = (DecPOMDPDiscreteInterface *)0x0;
    }
    else {
      p_00 = (DecPOMDPDiscreteInterface *)
             (&(p->super_TransitionObservationIndependentMADPDiscrete).
               super_MultiAgentDecisionProcess.field_0x0 +
             *(long *)(*(long *)&(p->super_TransitionObservationIndependentMADPDiscrete).
                                 super_MultiAgentDecisionProcess + -0x50));
    }
    PlanningUnitDecPOMDPDiscrete::SetProblem(&this->super_PlanningUnitDecPOMDPDiscrete,p_00);
    (*(this->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.super_PlanningUnit.
      _vptr_PlanningUnit[5])(this);
    return;
  }
  return;
}

Assistant:

void PlanningUnitTOIDecPOMDPDiscrete::SetProblem(TOIDecPOMDPDiscrete* p)
{
    if(p == _m_TOIDecPOMDPDiscrete)
        return;
    _m_TOIDecPOMDPDiscrete=p;
#if 0
    //set (and initialize) the problem at PlanningUnitDecPOMDPDiscrete level:
    DecPOMDPDiscreteInterface* p2 = 
        static_cast<DecPOMDPDiscreteInterface*>(p);
#endif
    PlanningUnitDecPOMDPDiscrete::SetProblem(p);

    SanityCheck();
}